

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O0

void __thiscall Js::ProbeContainer::Close(ProbeContainer *this)

{
  ThreadContext *this_00;
  DebugManager *pDVar1;
  ProbeContainer *this_local;
  
  if (this->pScriptContext == (ScriptContext *)0x0) {
    this->debugManager = (DebugManager *)0x0;
  }
  else {
    this_00 = ScriptContext::GetThreadContext(this->pScriptContext);
    pDVar1 = ThreadContext::GetDebugManager(this_00);
    this->debugManager = pDVar1;
  }
  if ((this->debugManager != (DebugManager *)0x0) &&
     ((this->debugManager->stepController).pActivatedContext == this->pScriptContext)) {
    StepController::Deactivate(&this->debugManager->stepController,(InterpreterHaltState *)0x0);
  }
  this->pScriptContext = (ScriptContext *)0x0;
  this->debugManager = (DebugManager *)0x0;
  return;
}

Assistant:

void ProbeContainer::Close()
    {
        // Probe manager instance may go down early.
        if (this->pScriptContext)
        {
            debugManager = this->pScriptContext->GetThreadContext()->GetDebugManager();
        }
        else
        {
            debugManager = nullptr;
        }
        if (debugManager != nullptr && debugManager->stepController.pActivatedContext == pScriptContext)
        {
            debugManager->stepController.Deactivate();
        }
#ifdef ENABLE_MUTATION_BREAKPOINT
        this->RemoveMutationBreakpointListIfNeeded();
#endif
        pScriptContext = nullptr;
        debugManager = nullptr;
    }